

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

BinaryRegion *
flatbuffers::anon_unknown_49::MakeBinaryRegion
          (BinaryRegion *__return_storage_ptr__,uint64_t offset,uint64_t length,
          BinaryRegionType type,uint64_t array_length,uint64_t points_to_offset,
          BinaryRegionComment *comment)

{
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->array_length = 0;
  __return_storage_ptr__->points_to_offset = 0;
  (__return_storage_ptr__->comment).status = OK;
  (__return_storage_ptr__->comment).status_message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->comment).status_message.field_2;
  (__return_storage_ptr__->comment).status_message._M_string_length = 0;
  (__return_storage_ptr__->comment).status_message.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->comment).type = Unknown;
  (__return_storage_ptr__->comment).name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->comment).name.field_2;
  (__return_storage_ptr__->comment).name._M_string_length = 0;
  (__return_storage_ptr__->comment).name.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->comment).default_value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->comment).default_value.field_2;
  (__return_storage_ptr__->comment).default_value._M_string_length = 0;
  (__return_storage_ptr__->comment).default_value.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->comment).index = 0;
  __return_storage_ptr__->offset = offset;
  __return_storage_ptr__->length = length;
  __return_storage_ptr__->type = type;
  __return_storage_ptr__->array_length = array_length;
  __return_storage_ptr__->points_to_offset = points_to_offset;
  (__return_storage_ptr__->comment).status = comment->status;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->comment).status_message,
             (string *)&comment->status_message);
  (__return_storage_ptr__->comment).type = comment->type;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->comment).name,(string *)&comment->name);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->comment).default_value,
             (string *)&comment->default_value);
  (__return_storage_ptr__->comment).index = comment->index;
  return __return_storage_ptr__;
}

Assistant:

static BinaryRegion MakeBinaryRegion(
    const uint64_t offset = 0, const uint64_t length = 0,
    const BinaryRegionType type = BinaryRegionType::Unknown,
    const uint64_t array_length = 0, const uint64_t points_to_offset = 0,
    BinaryRegionComment comment = {}) {
  BinaryRegion region;
  region.offset = offset;
  region.length = length;
  region.type = type;
  region.array_length = array_length;
  region.points_to_offset = points_to_offset;
  region.comment = std::move(comment);
  return region;
}